

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

GLchar * __thiscall
gl4cts::GPUShaderFP64Test2::getShaderStageName(GPUShaderFP64Test2 *this,shaderStage shader_stage)

{
  if (shader_stage < (TESS_EVAL_SHADER|GEOMETRY_SHADER)) {
    return *(GLchar **)(&DAT_020d37d8 + (ulong)shader_stage * 8);
  }
  return (GLchar *)0x0;
}

Assistant:

const glw::GLchar* GPUShaderFP64Test2::getShaderStageName(shaderStage shader_stage) const
{
	switch (shader_stage)
	{
	case COMPUTE_SHADER:
		return "compute shader";
		break;
	case FRAGMENT_SHADER:
		return "fragment shader";
		break;
	case GEOMETRY_SHADER:
		return "geometry shader";
		break;
	case TESS_CTRL_SHADER:
		return "tesselation control shader";
		break;
	case TESS_EVAL_SHADER:
		return "tesselation evaluation shader";
		break;
	case VERTEX_SHADER:
		return "vertex shader";
		break;
	}

	return 0;
}